

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

_Bool reserved_symbolic(int32_t c)

{
  _Bool local_9;
  int32_t c_local;
  
  switch(c) {
  case 0x22:
  case 0x27:
  case 0x28:
  case 0x29:
  case 0x2c:
  case 0x3b:
  case 0x5b:
  case 0x5d:
  case 0x5f:
  case 0x60:
  case 0x7b:
  case 0x7d:
    local_9 = true;
    break;
  default:
    local_9 = false;
  }
  return local_9;
}

Assistant:

static bool reserved_symbolic(const int32_t c) {
  switch (c) {
    case '(':
    case ')':
    case ',':
    case ';':
    case '[':
    case ']':
    case '`':
    case '{':
    case '}':
    case '"':
    case '\'':
    case '_':
      return true;
    default: return false;
  }
}